

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  InternalString *str;
  WriteBarrierPtr<JsUtil::DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_> *src
  ;
  code *pcVar1;
  uint size;
  bool bVar2;
  hash_t hVar3;
  uint uVar4;
  EntryType *pEVar5;
  undefined4 *puVar6;
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  long lVar7;
  long lVar8;
  int *local_50;
  int *newBuckets;
  EntryType *local_40;
  int local_38;
  uint local_34;
  int modIndex;
  
  size = this->count * 2;
  local_38 = 0x4b;
  local_34 = DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetBucketSize(size,&local_38);
  local_50 = (int *)0x0;
  local_40 = (DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_> *)0x0;
  if (local_34 == this->bucketCount) {
    pEVar5 = AllocateEntries(this,size,true);
    Memory::
    CopyArray<JsUtil::DictionaryEntry<Js::InternalString,Memory::WriteBarrierPtr<void>>,Memory::WriteBarrierPtr<void>,Memory::RecyclerNonLeafAllocator>
              (pEVar5,(long)(int)size,&this->entries,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::
    WriteBarrierPtr<JsUtil::DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>::
    WriteBarrierSet(&this->entries,pEVar5);
    this->size = size;
    this->modFunctionIndex = local_38;
  }
  else {
    newBuckets = (int *)this;
    Allocate(this,&local_50,&local_40,local_34,size);
    this_00 = (BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
               *)newBuckets;
    src = (WriteBarrierPtr<JsUtil::DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
           *)(newBuckets + 2);
    Memory::
    CopyArray<JsUtil::DictionaryEntry<Js::InternalString,Memory::WriteBarrierPtr<void>>,Memory::WriteBarrierPtr<void>,Memory::RecyclerNonLeafAllocator>
              (local_40,(long)(int)size,src,(long)newBuckets[8]);
    *(int *)((long)this_00 + 0x2c) = local_38;
    lVar7 = 0x10;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (lVar8 = 0; pEVar5 = local_40, lVar8 < this_00->count; lVar8 = lVar8 + 1) {
      if (-2 < *(int *)((long)local_40 + lVar7 + -8)) {
        str = (InternalString *)
              ((long)&(local_40->
                      super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      ).super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
                      super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
                      .
                      super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>
                      .value.ptr + lVar7);
        hVar3 = Js::InternalStringComparer::GetHashCode(str);
        hVar3 = hVar3 * 2 + 1;
        if (hVar3 != *(hash_t *)
                      ((long)&(pEVar5->
                              super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                              ).
                              super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>
                              .
                              super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
                              .
                              super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>
                              .key.m_charLength + lVar7)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,0xce,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
          hVar3 = str[1].m_charLength;
        }
        this_00 = (BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                   *)newBuckets;
        uVar4 = GetBucket(hVar3,local_34,newBuckets[0xb]);
        *(int *)((long)local_40 + lVar7 + -8) = local_50[(int)uVar4];
        local_50[(int)uVar4] = (int)lVar8;
      }
      lVar7 = lVar7 + 0x28;
    }
    DeleteBuckets(this_00,(this_00->buckets).ptr,this_00->bucketCount);
    DeleteEntries(this_00,(this_00->entries).ptr,this_00->size);
    if (this_00->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this_00->stats,size,size - this_00->size);
    }
    Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this_00->buckets,local_50);
    Memory::
    WriteBarrierPtr<JsUtil::DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>::
    WriteBarrierSet(src,local_40);
    this_00->bucketCount = local_34;
    this_00->size = size;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }